

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsValue.c
# Opt level: O3

void JsToBoolean(JsValue *val,JsValue *res)

{
  double dVar1;
  undefined4 uVar2;
  
  res->type = JS_BOOLEAN;
  switch(val->type) {
  case JS_UNDEFINED:
  case JS_NULL:
    break;
  case JS_BOOLEAN:
    (res->u).reference.name = (val->u).reference.name;
    uVar2 = *(undefined4 *)&val->field_0x4;
    dVar1 = (val->u).number;
    res->type = val->type;
    *(undefined4 *)&res->field_0x4 = uVar2;
    (res->u).number = dVar1;
    return;
  case JS_NUMBER:
    if ((val->u).number != 0.0) goto switchD_00111e05_caseD_5;
    break;
  case JS_STRING:
    if (((val->u).string != (char *)0x0) && (*(val->u).string != '\0'))
    goto switchD_00111e05_caseD_5;
    break;
  case JS_OBJECT:
switchD_00111e05_caseD_5:
    (res->u).boolean = 1;
    return;
  default:
    JsThrowString("JsToBooleanError");
    return;
  }
  (res->u).boolean = 0;
  return;
}

Assistant:

void JsToBoolean(struct JsValue *val, struct JsValue *res){
	
	res->type  = JS_BOOLEAN;
	switch (val->type) {
	case JS_UNDEFINED:
	case JS_NULL:
		res->u.boolean = FALSE;
		break;
	case JS_BOOLEAN:
		*res  = * val;
		break;
	case JS_NUMBER:
		if (val->u.number == 0 || isnan(val->u.number))
			res->u.boolean = FALSE;
		else
			res->u.boolean = TRUE;
		break;
	case JS_STRING:
		if (val->u.string == NULL || strlen(val->u.string) == 0)
			res->u.boolean = FALSE;
		else
			res->u.boolean = TRUE;
		break;
	case JS_OBJECT:
		res->u.boolean = TRUE;
		break;
	default:
		JsThrowString("JsToBooleanError");
	}
}